

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target)

{
  uint uVar1;
  char *data;
  string *psVar2;
  FileDescriptorProto *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint32 uVar7;
  long lVar8;
  uint8 *puVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar8 = 0;
    do {
      puVar6 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar8];
      data = (char *)*puVar6;
      if ((int)uVar5 <= lVar8) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
        puVar6 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar8]
        ;
      }
      internal::WireFormat::VerifyUTF8StringFallback(data,*(int *)(puVar6 + 1),SERIALIZE);
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar8) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
      }
      puVar6 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = '\n';
      uVar7 = (uint32)puVar6[1];
      if (uVar7 < 0x80) {
        target[1] = (uint8)puVar6[1];
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
      }
      target = io::CodedOutputStream::WriteRawToArray((void *)*puVar6,*(int *)(puVar6 + 1),puVar9);
      lVar8 = lVar8 + 1;
      uVar5 = (ulong)(this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
    } while (lVar8 < (long)uVar5);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
               SERIALIZE);
    psVar2 = this->parameter_;
    *target = '\x12';
    uVar7 = (uint32)psVar2->_M_string_length;
    if (uVar7 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar9 = target + 2;
    }
    else {
      puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar9);
  }
  if (0 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      this_00 = (FileDescriptorProto *)
                (this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar8];
      *target = 'z';
      uVar1 = this_00->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar9 = target + 2;
      }
      else {
        puVar9 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = FileDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        15, this->proto_file(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}